

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

int trie_append(trie dest,trie src)

{
  trie_node_append_iterator_args_type args;
  
  if (src != (trie)0x0 && dest != (trie)0x0) {
    args.dest = dest;
    args.prefixes = vector_create(8);
    trie_iterate(src,trie_node_append_cb_iterator,&args);
    vector_destroy(args.prefixes);
    return 0;
  }
  return 1;
}

Assistant:

int trie_append(trie dest, trie src)
{
	if (dest != NULL && src != NULL)
	{
		struct trie_node_append_iterator_args_type args;

		args.dest = dest;
		args.prefixes = vector_create(sizeof(trie_key));

		trie_iterate(src, &trie_node_append_cb_iterator, &args);

		vector_destroy(args.prefixes);

		return 0;
	}

	return 1;
}